

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

void __thiscall cmCTestLaunch::ComputeFileNames(cmCTestLaunch *this)

{
  bool bVar1;
  string *path;
  string local_78;
  reference local_58;
  string *realArg;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_28 [8];
  cmCryptoHash md5;
  char *d;
  cmCTestLaunch *this_local;
  
  md5.CTX = (rhash_context *)getenv("CTEST_LAUNCH_LOGS");
  if ((md5.CTX != (rhash_context *)0x0) && ((char)(md5.CTX)->msg_size != '\0')) {
    this->Passthru = false;
    path = &this->LogDir;
    std::__cxx11::string::operator=((string *)path,(char *)md5.CTX);
    cmsys::SystemTools::ConvertToUnixSlashes(path);
    std::__cxx11::string::operator+=((string *)path,"/");
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_28,AlgoMD5);
    cmCryptoHash::Initialize((cmCryptoHash *)local_28);
    cmCryptoHash::Append((cmCryptoHash *)local_28,&this->CWD);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->RealArgs);
    realArg = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->RealArgs);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&realArg), bVar1) {
      local_58 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      cmCryptoHash::Append((cmCryptoHash *)local_28,local_58);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    cmCryptoHash::FinalizeHex_abi_cxx11_(&local_78,(cmCryptoHash *)local_28);
    std::__cxx11::string::operator=((string *)&this->LogHash,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::operator=((string *)&this->LogOut,(string *)&this->LogDir);
    std::__cxx11::string::operator+=((string *)&this->LogOut,"launch-");
    std::__cxx11::string::operator+=((string *)&this->LogOut,(string *)&this->LogHash);
    std::__cxx11::string::operator+=((string *)&this->LogOut,"-out.txt");
    std::__cxx11::string::operator=((string *)&this->LogErr,(string *)&this->LogDir);
    std::__cxx11::string::operator+=((string *)&this->LogErr,"launch-");
    std::__cxx11::string::operator+=((string *)&this->LogErr,(string *)&this->LogHash);
    std::__cxx11::string::operator+=((string *)&this->LogErr,"-err.txt");
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_28);
  }
  return;
}

Assistant:

void cmCTestLaunch::ComputeFileNames()
{
  // We just passthru the behavior of the real command unless the
  // CTEST_LAUNCH_LOGS environment variable is set.
  const char* d = getenv("CTEST_LAUNCH_LOGS");
  if (!(d && *d)) {
    return;
  }
  this->Passthru = false;

  // The environment variable specifies the directory into which we
  // generate build logs.
  this->LogDir = d;
  cmSystemTools::ConvertToUnixSlashes(this->LogDir);
  this->LogDir += "/";

  // We hash the input command working dir and command line to obtain
  // a repeatable and (probably) unique name for log files.
  cmCryptoHash md5(cmCryptoHash::AlgoMD5);
  md5.Initialize();
  md5.Append(this->CWD);
  for (std::string const& realArg : this->RealArgs) {
    md5.Append(realArg);
  }
  this->LogHash = md5.FinalizeHex();

  // We store stdout and stderr in temporary log files.
  this->LogOut = this->LogDir;
  this->LogOut += "launch-";
  this->LogOut += this->LogHash;
  this->LogOut += "-out.txt";
  this->LogErr = this->LogDir;
  this->LogErr += "launch-";
  this->LogErr += this->LogHash;
  this->LogErr += "-err.txt";
}